

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::LoadableGetStateBlock_x
          (ChContactTriangleXYZ *this,int block_offset,ChState *mD)

{
  double *pdVar1;
  double *pdVar2;
  element_type *peVar3;
  long lVar4;
  Index index;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (block_offset < 0) goto LAB_0062788e;
  lVar4 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar4 < block_offset) goto LAB_0062788e;
  pdVar2 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar3 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar2 + block_offset;
  uVar5 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar5 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_00627784;
  }
  else {
LAB_00627784:
    uVar7 = 0;
    do {
      pdVar1[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (uVar5 < 3) {
    do {
      pdVar1[uVar5] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  uVar5 = (ulong)(uint)block_offset;
  if (lVar4 < (long)(uVar5 + 3)) goto LAB_0062788e;
  peVar3 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar2 + uVar5 + 3;
  uVar7 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar7 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_006277f7;
  }
  else {
LAB_006277f7:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (uVar7 < 3) {
    do {
      pdVar1[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  if (lVar4 < (long)(uVar5 + 6)) {
LAB_0062788e:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  peVar3 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar2 = pdVar2 + uVar5 + 6;
  uVar5 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar5 = (ulong)uVar6;
    }
    if (uVar6 == 0) goto LAB_00627872;
  }
  uVar7 = 0;
  do {
    pdVar2[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
    uVar7 = uVar7 + 1;
  } while (uVar5 != uVar7);
LAB_00627872:
  if (uVar5 < 3) {
    do {
      pdVar2[uVar5] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  return;
}

Assistant:

void ChContactTriangleXYZ::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = mnode2->GetPos().eigen();
    mD.segment(block_offset + 6, 3) = mnode3->GetPos().eigen();
}